

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::reduction_op_keepdims<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  Allocator *pAVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  void *pvVar14;
  bool bVar15;
  long lVar16;
  void *pvVar17;
  long lVar18;
  void *pvVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  int unaff_R15D;
  float fVar24;
  void *ptr;
  Mat local_78;
  Allocator *local_38;
  
  sVar2 = a->elemsize;
  iVar1 = a->dims;
  if (iVar1 == 2) {
    uVar10 = a->w;
    uVar11 = (ulong)uVar10;
    iVar8 = a->h;
    lVar12 = (long)iVar8;
    if (reduce_w && reduce_h) {
      Mat::create(b,1,1,sVar2,opt->blob_allocator);
      local_38 = opt->workspace_allocator;
      if (iVar8 == 0) {
        piVar13 = (int *)0x0;
        pvVar14 = (void *)0x0;
      }
      else {
        uVar20 = sVar2 * lVar12 + 3 & 0xfffffffffffffffc;
        if (local_38 == (Allocator *)0x0) {
          local_78.data = (void *)0x0;
          iVar7 = posix_memalign(&local_78.data,0x10,uVar20 + 4);
          pvVar14 = local_78.data;
          if (iVar7 != 0) {
            local_78.data = (void *)0x0;
            pvVar14 = local_78.data;
          }
        }
        else {
          iVar7 = (*local_38->_vptr_Allocator[2])(local_38,uVar20 + 4);
          pvVar14 = (void *)CONCAT44(extraout_var,iVar7);
        }
        piVar13 = (int *)((long)pvVar14 + uVar20);
        *(undefined4 *)((long)pvVar14 + uVar20) = 1;
      }
      unaff_R15D = -100;
      if (iVar8 != 0 && pvVar14 != (void *)0x0) {
        if (0 < iVar8) {
          pvVar17 = a->data;
          iVar7 = a->w;
          sVar3 = a->elemsize;
          lVar16 = 0;
          do {
            fVar24 = 0.0;
            if (0 < (int)uVar10) {
              uVar20 = 0;
              do {
                fVar24 = fVar24 + *(float *)((long)pvVar17 + uVar20 * 4);
                uVar20 = uVar20 + 1;
              } while (uVar11 != uVar20);
            }
            *(float *)((long)pvVar14 + lVar16 * 4) = fVar24;
            lVar16 = lVar16 + 1;
            pvVar17 = (void *)((long)pvVar17 + (long)iVar7 * sVar3);
          } while (lVar16 != lVar12);
        }
        fVar24 = 0.0;
        if (0 < iVar8) {
          lVar16 = 0;
          do {
            fVar24 = fVar24 + *(float *)((long)pvVar14 + lVar16 * 4);
            lVar16 = lVar16 + 1;
          } while (lVar12 != lVar16);
        }
        *(float *)b->data = fVar24;
        unaff_R15D = 0;
      }
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_38 != (Allocator *)0x0) {
            (*local_38->_vptr_Allocator[3])(local_38,pvVar14);
            goto LAB_001493a2;
          }
          if (pvVar14 != (void *)0x0) {
            free(pvVar14);
          }
          bVar15 = false;
          goto LAB_001493ba;
        }
      }
      bVar15 = false;
    }
    else if (reduce_w && !reduce_h) {
      Mat::create(b,1,iVar8,sVar2,opt->blob_allocator);
      if (0 < iVar8) {
        pvVar14 = a->data;
        iVar8 = a->w;
        pvVar17 = b->data;
        sVar3 = a->elemsize;
        lVar16 = 0;
        do {
          fVar24 = 0.0;
          if (0 < (int)uVar10) {
            uVar20 = 0;
            do {
              fVar24 = fVar24 + *(float *)((long)pvVar14 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar11 != uVar20);
          }
          *(float *)((long)pvVar17 + lVar16 * 4) = fVar24;
          lVar16 = lVar16 + 1;
          pvVar14 = (void *)((long)pvVar14 + (long)iVar8 * sVar3);
        } while (lVar16 != lVar12);
        goto LAB_0014928d;
      }
      unaff_R15D = 0;
LAB_001493a2:
      bVar15 = false;
    }
    else if (reduce_h && !reduce_w) {
      Mat::create(b,uVar10,1,sVar2,opt->blob_allocator);
      uVar9 = b->c * (int)b->cstep;
      if (0 < (int)uVar9) {
        memset(b->data,0,(ulong)uVar9 << 2);
      }
      if (0 < iVar8) {
        pvVar14 = a->data;
        iVar8 = a->w;
        pvVar17 = b->data;
        sVar3 = a->elemsize;
        lVar16 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar20 = 0;
            do {
              *(float *)((long)pvVar17 + uVar20 * 4) =
                   *(float *)((long)pvVar14 + uVar20 * 4) + *(float *)((long)pvVar17 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar11 != uVar20);
          }
          lVar16 = lVar16 + 1;
          pvVar14 = (void *)((long)pvVar14 + (long)iVar8 * sVar3);
        } while (lVar16 != lVar12);
      }
LAB_0014928d:
      bVar15 = false;
      unaff_R15D = 0;
    }
    else {
      bVar15 = true;
    }
LAB_001493ba:
    if (!bVar15) {
      return unaff_R15D;
    }
  }
  else if (iVar1 == 1) {
    iVar1 = a->w;
    Mat::create(b,1,sVar2,opt->blob_allocator);
    if ((long)iVar1 < 1) {
      fVar24 = 0.0;
    }
    else {
      fVar24 = 0.0;
      lVar12 = 0;
      do {
        fVar24 = fVar24 + *(float *)((long)a->data + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (iVar1 != lVar12);
    }
    *(float *)b->data = fVar24;
    return 0;
  }
  if (iVar1 != 3) {
    return 0;
  }
  uVar10 = a->w;
  uVar11 = (ulong)uVar10;
  uVar9 = a->h;
  uVar20 = (ulong)uVar9;
  iVar1 = a->c;
  lVar12 = (long)iVar1;
  uVar22 = uVar9 * uVar10;
  bVar15 = !reduce_w;
  if ((!bVar15 && reduce_h) && reduce_c) {
    Mat::create(b,1,1,1,sVar2,opt->blob_allocator);
    pAVar6 = opt->workspace_allocator;
    if (iVar1 == 0) {
      piVar13 = (int *)0x0;
      pvVar14 = (void *)0x0;
    }
    else {
      uVar11 = sVar2 * lVar12 + 3 & 0xfffffffffffffffc;
      if (pAVar6 == (Allocator *)0x0) {
        local_78.data = (void *)0x0;
        iVar8 = posix_memalign(&local_78.data,0x10,uVar11 + 4);
        pvVar14 = local_78.data;
        if (iVar8 != 0) {
          local_78.data = (void *)0x0;
          pvVar14 = local_78.data;
        }
      }
      else {
        iVar8 = (*pAVar6->_vptr_Allocator[2])(pAVar6,uVar11 + 4);
        pvVar14 = (void *)CONCAT44(extraout_var_00,iVar8);
      }
      piVar13 = (int *)((long)pvVar14 + uVar11);
      *(undefined4 *)((long)pvVar14 + uVar11) = 1;
    }
    unaff_R15D = -100;
    if (iVar1 != 0 && pvVar14 != (void *)0x0) {
      if (0 < iVar1) {
        pvVar17 = a->data;
        sVar2 = a->cstep;
        sVar3 = a->elemsize;
        lVar16 = 0;
        do {
          fVar24 = 0.0;
          if (0 < (int)uVar22) {
            uVar11 = 0;
            do {
              fVar24 = fVar24 + *(float *)((long)pvVar17 + uVar11 * 4);
              uVar11 = uVar11 + 1;
            } while (uVar22 != uVar11);
          }
          *(float *)((long)pvVar14 + lVar16 * 4) = fVar24;
          lVar16 = lVar16 + 1;
          pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
        } while (lVar16 != lVar12);
      }
      fVar24 = 0.0;
      if (0 < iVar1) {
        lVar16 = 0;
        do {
          fVar24 = fVar24 + *(float *)((long)pvVar14 + lVar16 * 4);
          lVar16 = lVar16 + 1;
        } while (lVar12 != lVar16);
      }
      *(float *)b->data = fVar24;
      unaff_R15D = 0;
    }
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar14 != (void *)0x0) {
            free(pvVar14);
          }
        }
        else {
          (*pAVar6->_vptr_Allocator[3])(pAVar6,pvVar14);
        }
      }
    }
LAB_00149af6:
    bVar15 = false;
  }
  else {
    if ((!bVar15 && reduce_h) && !reduce_c) {
      Mat::create(b,1,1,iVar1,sVar2,opt->blob_allocator);
      if (0 < iVar1) {
        pvVar14 = a->data;
        sVar2 = a->cstep;
        pvVar17 = b->data;
        sVar3 = b->cstep;
        sVar4 = b->elemsize;
        sVar5 = a->elemsize;
        lVar16 = 0;
        do {
          fVar24 = 0.0;
          if (0 < (int)uVar22) {
            uVar11 = 0;
            do {
              fVar24 = fVar24 + *(float *)((long)pvVar14 + uVar11 * 4);
              uVar11 = uVar11 + 1;
            } while (uVar22 != uVar11);
          }
          *(float *)((long)pvVar17 + sVar3 * sVar4 * lVar16) = fVar24;
          lVar16 = lVar16 + 1;
          pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar5);
        } while (lVar16 != lVar12);
      }
    }
    else {
      lVar16 = (long)(int)uVar10;
      if ((bVar15 || reduce_h) || reduce_c) {
        if ((!bVar15 && !reduce_h) && reduce_c) {
          Mat::create(b,1,uVar9,1,sVar2,opt->blob_allocator);
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.c = 0;
          local_78.cstep = 0;
          Mat::create(&local_78,1,uVar9,iVar1,sVar2,opt->workspace_allocator);
          unaff_R15D = -100;
          if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
            if (0 < local_78.c * (int)local_78.cstep) {
              memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
            }
            if (0 < iVar1) {
              pvVar14 = a->data;
              sVar2 = a->cstep;
              sVar3 = a->elemsize;
              lVar18 = 0;
              do {
                if (0 < (int)uVar9) {
                  uVar21 = 0;
                  pvVar17 = pvVar14;
                  do {
                    fVar24 = 0.0;
                    if (0 < (int)uVar10) {
                      uVar23 = 0;
                      do {
                        fVar24 = fVar24 + *(float *)((long)pvVar17 + uVar23 * 4);
                        uVar23 = uVar23 + 1;
                      } while (uVar11 != uVar23);
                    }
                    *(float *)((long)local_78.data +
                              uVar21 * 4 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                              lVar18) = fVar24;
                    uVar21 = uVar21 + 1;
                    pvVar17 = (void *)((long)pvVar17 + lVar16 * 4);
                  } while (uVar21 != uVar20);
                }
                lVar18 = lVar18 + 1;
                pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar3);
              } while (lVar18 != lVar12);
            }
            uVar10 = b->c * (int)b->cstep;
            if (0 < (int)uVar10) {
              memset(b->data,0,(ulong)uVar10 << 2);
            }
            if (0 < iVar1) {
              pvVar14 = b->data;
              lVar16 = 0;
              pvVar17 = local_78.data;
              do {
                if (0 < (int)uVar9) {
                  uVar11 = 0;
                  do {
                    *(float *)((long)pvVar14 + uVar11 * 4) =
                         *(float *)((long)pvVar17 + uVar11 * 4) +
                         *(float *)((long)pvVar14 + uVar11 * 4);
                    uVar11 = uVar11 + 1;
                  } while (uVar20 != uVar11);
                }
                lVar16 = lVar16 + 1;
                pvVar17 = (void *)((long)pvVar17 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (lVar16 != lVar12);
            }
LAB_00149ae9:
            unaff_R15D = 0;
          }
        }
        else {
          if ((!reduce_h || reduce_w) || !reduce_c) {
            if ((!reduce_w && !reduce_h) && reduce_c) {
              Mat::create(b,uVar10,uVar9,1,sVar2,opt->blob_allocator);
              uVar10 = b->c * (int)b->cstep;
              if (0 < (int)uVar10) {
                memset(b->data,0,(ulong)uVar10 << 2);
              }
              if (0 < iVar1) {
                sVar2 = a->cstep;
                sVar3 = a->elemsize;
                pvVar14 = a->data;
                pvVar17 = b->data;
                lVar16 = 0;
                unaff_R15D = 0;
                do {
                  if (0 < (int)uVar22) {
                    uVar11 = 0;
                    do {
                      *(float *)((long)pvVar17 + uVar11 * 4) =
                           *(float *)((long)pvVar14 + uVar11 * 4) +
                           *(float *)((long)pvVar17 + uVar11 * 4);
                      uVar11 = uVar11 + 1;
                    } while (uVar22 != uVar11);
                  }
                  lVar16 = lVar16 + 1;
                  pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar3);
                  bVar15 = false;
                } while (lVar16 != lVar12);
                goto LAB_00149af8;
              }
            }
            else {
              bVar15 = true;
              if ((!reduce_h || reduce_w) || reduce_c) goto LAB_00149af8;
              Mat::create(b,uVar10,1,iVar1,sVar2,opt->blob_allocator);
              uVar22 = b->c * (int)b->cstep;
              if (0 < (int)uVar22) {
                memset(b->data,0,(ulong)uVar22 << 2);
              }
              if (0 < iVar1) {
                pvVar14 = a->data;
                sVar2 = a->cstep;
                pvVar17 = b->data;
                sVar3 = b->cstep;
                sVar4 = a->elemsize;
                sVar5 = b->elemsize;
                lVar18 = 0;
                unaff_R15D = 0;
                do {
                  if (0 < (int)uVar9) {
                    uVar22 = 0;
                    pvVar19 = pvVar14;
                    do {
                      if (0 < (int)uVar10) {
                        uVar20 = 0;
                        do {
                          *(float *)((long)pvVar17 + uVar20 * 4) =
                               *(float *)((long)pvVar19 + uVar20 * 4) +
                               *(float *)((long)pvVar17 + uVar20 * 4);
                          uVar20 = uVar20 + 1;
                        } while (uVar11 != uVar20);
                      }
                      uVar22 = uVar22 + 1;
                      pvVar19 = (void *)((long)pvVar19 + lVar16 * 4);
                    } while (uVar22 != uVar9);
                  }
                  lVar18 = lVar18 + 1;
                  pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar4);
                  pvVar17 = (void *)((long)pvVar17 + sVar3 * sVar5);
                  bVar15 = false;
                } while (lVar18 != lVar12);
                goto LAB_00149af8;
              }
            }
            goto LAB_001496b2;
          }
          Mat::create(b,uVar10,1,1,sVar2,opt->blob_allocator);
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.c = 0;
          local_78.cstep = 0;
          Mat::create(&local_78,uVar10,1,iVar1,sVar2,opt->workspace_allocator);
          unaff_R15D = -100;
          if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
            if (0 < local_78.c * (int)local_78.cstep) {
              memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
            }
            if (0 < iVar1) {
              pvVar14 = a->data;
              sVar2 = a->cstep;
              sVar3 = a->elemsize;
              lVar18 = 0;
              pvVar17 = local_78.data;
              do {
                if (0 < (int)uVar9) {
                  uVar22 = 0;
                  pvVar19 = pvVar14;
                  do {
                    if (0 < (int)uVar10) {
                      uVar20 = 0;
                      do {
                        *(float *)((long)pvVar17 + uVar20 * 4) =
                             *(float *)((long)pvVar19 + uVar20 * 4) +
                             *(float *)((long)pvVar17 + uVar20 * 4);
                        uVar20 = uVar20 + 1;
                      } while (uVar11 != uVar20);
                    }
                    uVar22 = uVar22 + 1;
                    pvVar19 = (void *)((long)pvVar19 + lVar16 * 4);
                  } while (uVar22 != uVar9);
                }
                lVar18 = lVar18 + 1;
                pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar3);
                pvVar17 = (void *)((long)pvVar17 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (lVar18 != lVar12);
            }
            uVar9 = b->c * (int)b->cstep;
            if (0 < (int)uVar9) {
              memset(b->data,0,(ulong)uVar9 << 2);
            }
            if (0 < iVar1) {
              pvVar14 = b->data;
              lVar16 = 0;
              pvVar17 = local_78.data;
              do {
                if (0 < (int)uVar10) {
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar14 + uVar20 * 4) =
                         *(float *)((long)pvVar17 + uVar20 * 4) +
                         *(float *)((long)pvVar14 + uVar20 * 4);
                    uVar20 = uVar20 + 1;
                  } while (uVar11 != uVar20);
                }
                lVar16 = lVar16 + 1;
                pvVar17 = (void *)((long)pvVar17 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (lVar16 != lVar12);
            }
            goto LAB_00149ae9;
          }
        }
        Mat::~Mat(&local_78);
        goto LAB_00149af6;
      }
      Mat::create(b,1,uVar9,iVar1,sVar2,opt->blob_allocator);
      if (0 < iVar1) {
        pvVar14 = a->data;
        sVar2 = a->cstep;
        sVar3 = b->cstep;
        sVar4 = b->elemsize;
        sVar5 = a->elemsize;
        pvVar17 = b->data;
        lVar18 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar21 = 0;
            pvVar19 = pvVar14;
            do {
              fVar24 = 0.0;
              if (0 < (int)uVar10) {
                uVar23 = 0;
                do {
                  fVar24 = fVar24 + *(float *)((long)pvVar19 + uVar23 * 4);
                  uVar23 = uVar23 + 1;
                } while (uVar11 != uVar23);
              }
              *(float *)((long)pvVar17 + uVar21 * 4 + sVar3 * sVar4 * lVar18) = fVar24;
              uVar21 = uVar21 + 1;
              pvVar19 = (void *)((long)pvVar19 + lVar16 * 4);
            } while (uVar21 != uVar20);
          }
          lVar18 = lVar18 + 1;
          pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar5);
        } while (lVar18 != lVar12);
      }
    }
LAB_001496b2:
    bVar15 = false;
    unaff_R15D = 0;
  }
LAB_00149af8:
  if (bVar15) {
    return 0;
  }
  return unaff_R15D;
}

Assistant:

static int reduction_op_keepdims(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i=0; i<w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> 1 1
            b.create(1, 1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i=0; i<h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> 1 h
            b.create(1, h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }

            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w 1
            b.create(w, 1, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);
                for (int j=0; j<w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }

            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> 1 1 1
            b.create(1, 1, 1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i=0; i<channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> 1 1 c
            b.create(1, 1, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[0] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> 1 h c
            b.create(1, h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> 1 h 1
            b.create(1, h, 1, elemsize, opt.blob_allocator);

            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }
            
            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i=0; i<h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w 1 1
            b.create(w, 1, 1, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j=0; j<w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h 1
            b.create(w, h, 1, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i=0; i<size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w 1 c
            b.create(w, 1, channels, elemsize, opt.blob_allocator);
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            return 0;
        }
    }

    return 0;
}